

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O2

clock_t Data::times(tms *__buffer)

{
  long *plVar1;
  long lVar2;
  clock_t cVar3;
  long *plVar4;
  
  plVar4 = (long *)__buffer->tms_utime;
  if (*plVar4 == 0) {
    cVar3 = 0;
  }
  else {
    cVar3 = 0;
    lVar2 = __dynamic_cast(*plVar4,&typeinfo,&Integer::typeinfo,0);
    if (lVar2 != 0) {
      cVar3 = Integer::times(__buffer);
      plVar4 = (long *)__buffer->tms_utime;
    }
  }
  plVar1 = (long *)__buffer->tms_stime;
  for (; plVar4 != plVar1; plVar4 = plVar4 + 1) {
    check((Data *)*plVar4);
  }
  std::_Vector_base<Data_*,_std::allocator<Data_*>_>::~_Vector_base
            ((_Vector_base<Data_*,_std::allocator<Data_*>_> *)__buffer);
  operator_delete(__buffer);
  return cVar3;
}

Assistant:

Data *Data::times(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0])) != NULL) {
        result = Integer::times(dataPara);
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}